

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3rbu_close(sqlite3rbu *p,char **pzErrmsg)

{
  char *pcVar1;
  sqlite3_file *psVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  
  if (p == (sqlite3rbu *)0x0) {
    *pzErrmsg = (char *)0x0;
    return 7;
  }
  iVar3 = p->eStage;
  if (p->rc == 0) {
    if (iVar3 == 1) {
      iVar4 = sqlite3_exec(p->dbMain,"COMMIT",(sqlite3_callback)0x0,(void *)0x0,&p->zErrmsg);
      p->rc = iVar4;
      iVar3 = p->eStage;
      if (iVar4 != 0) goto LAB_001301a4;
    }
    if (iVar3 == 4) {
      psVar2 = p->pTargetFd->pReal;
      iVar3 = (*psVar2->pMethods->xSync)(psVar2,2);
      p->rc = iVar3;
      iVar3 = p->eStage;
    }
  }
LAB_001301a4:
  rbuSaveState(p,iVar3);
  if ((p->rc == 0) && (p->eStage == 1)) {
    iVar3 = sqlite3_exec(p->dbRbu,"COMMIT",(sqlite3_callback)0x0,(void *)0x0,&p->zErrmsg);
    p->rc = iVar3;
  }
  rbuObjIterFinalize(&p->objiter);
  if ((((p->zTarget == (char *)0x0) && (p->rc != 0)) && (p->dbRbu != (sqlite3 *)0x0)) &&
     (iVar3 = sqlite3_exec(p->dbRbu,"DELETE FROM stat.rbu_state",(sqlite3_callback)0x0,(void *)0x0,
                           (char **)0x0), iVar3 != 0 && p->rc == 0x65)) {
    p->rc = iVar3;
  }
  sqlite3Close(p->dbRbu,0);
  sqlite3Close(p->dbMain,0);
  if (p->zVfsName != (char *)0x0) {
    sqlite3rbu_destroy_vfs(p->zVfsName);
    p->zVfsName = (char *)0x0;
  }
  sqlite3_free(p->aBuf);
  sqlite3_free(p->aFrame);
  iVar3 = p->rc;
  if (iVar3 == 0x13) {
    iVar3 = 0x13;
    if ((p->zErrmsg != (char *)0x0) && (sVar5 = strlen(p->zErrmsg), sVar5 != 8)) {
      iVar3 = 8;
      uVar8 = 0;
      do {
        pcVar1 = p->zErrmsg;
        if (*(long *)(pcVar1 + uVar8) == 0x5f706d695f756272) {
          uVar6 = 7;
          do {
            uVar7 = (iVar3 + uVar6) - 7;
            uVar6 = uVar6 + 1;
          } while ((byte)(pcVar1[uVar7] - 0x30U) < 10);
          memmove(pcVar1 + uVar8,pcVar1 + uVar7,(sVar5 - (uVar8 + uVar6)) + 1);
          sVar5 = sVar5 - uVar6;
        }
        uVar8 = (ulong)((int)uVar8 + 1);
        iVar3 = iVar3 + 1;
      } while (uVar8 < sVar5 - 8);
      iVar3 = p->rc;
    }
  }
  if (pzErrmsg == (char **)0x0) {
    sqlite3_free(p->zErrmsg);
  }
  else {
    *pzErrmsg = p->zErrmsg;
  }
  sqlite3_free(p->zState);
  sqlite3_free(p);
  return iVar3;
}

Assistant:

SQLITE_API int sqlite3rbu_close(sqlite3rbu *p, char **pzErrmsg){
  int rc;
  if( p ){

    /* Commit the transaction to the *-oal file. */
    if( p->rc==SQLITE_OK && p->eStage==RBU_STAGE_OAL ){
      p->rc = sqlite3_exec(p->dbMain, "COMMIT", 0, 0, &p->zErrmsg);
    }

    /* Sync the db file if currently doing an incremental checkpoint */
    if( p->rc==SQLITE_OK && p->eStage==RBU_STAGE_CKPT ){
      sqlite3_file *pDb = p->pTargetFd->pReal;
      p->rc = pDb->pMethods->xSync(pDb, SQLITE_SYNC_NORMAL);
    }

    rbuSaveState(p, p->eStage);

    if( p->rc==SQLITE_OK && p->eStage==RBU_STAGE_OAL ){
      p->rc = sqlite3_exec(p->dbRbu, "COMMIT", 0, 0, &p->zErrmsg);
    }

    /* Close any open statement handles. */
    rbuObjIterFinalize(&p->objiter);

    /* If this is an RBU vacuum handle and the vacuum has either finished
    ** successfully or encountered an error, delete the contents of the 
    ** state table. This causes the next call to sqlite3rbu_vacuum() 
    ** specifying the current target and state databases to start a new
    ** vacuum from scratch.  */
    if( rbuIsVacuum(p) && p->rc!=SQLITE_OK && p->dbRbu ){
      int rc2 = sqlite3_exec(p->dbRbu, "DELETE FROM stat.rbu_state", 0, 0, 0);
      if( p->rc==SQLITE_DONE && rc2!=SQLITE_OK ) p->rc = rc2;
    }

    /* Close the open database handle and VFS object. */
    sqlite3_close(p->dbRbu);
    sqlite3_close(p->dbMain);
    assert( p->szTemp==0 );
    rbuDeleteVfs(p);
    sqlite3_free(p->aBuf);
    sqlite3_free(p->aFrame);

    rbuEditErrmsg(p);
    rc = p->rc;
    if( pzErrmsg ){
      *pzErrmsg = p->zErrmsg;
    }else{
      sqlite3_free(p->zErrmsg);
    }
    sqlite3_free(p->zState);
    sqlite3_free(p);
  }else{
    rc = SQLITE_NOMEM;
    *pzErrmsg = 0;
  }
  return rc;
}